

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsFunctionInfo
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  undefined8 uVar1;
  undefined8 uVar2;
  AsmJsFunctionInfo *pAVar3;
  byte *pbVar4;
  Recycler *pRVar5;
  uint *ptr;
  Which *ptr_00;
  TypedSlotInfo *pTVar6;
  int i;
  ulong uVar7;
  TypedSlotInfo *info;
  int i_2;
  Types type;
  undefined1 local_78 [8];
  bool boolVal;
  ulong local_68;
  char *local_60;
  DWORD local_58;
  Which local_4c;
  AsmJsRetType local_48;
  int retVal;
  AsmJsFunctionInfo *pAStack_40;
  ArgSlot argByteSize;
  ushort local_34;
  Type local_32 [3];
  ArgSlot argSizeArrayLength;
  ArgSlot argCount;
  
  pAVar3 = FunctionBody::AllocateAsmJsFunctionInfo(function);
  pbVar4 = ReadInt32(this,current,(int *)&local_4c);
  AsmJsRetType::AsmJsRetType(&local_48,local_4c);
  (pAVar3->mReturnType).which_ = local_48.which_;
  pbVar4 = ReadUInt16(this,pbVar4,local_32);
  pAVar3->mArgCount = local_32[0];
  pbVar4 = ReadUInt16(this,pbVar4,(uint16 *)((long)&retVal + 2));
  pAVar3->mArgByteSize = retVal._2_2_;
  pAStack_40 = pAVar3;
  pbVar4 = ReadUInt16(this,pbVar4,&local_34);
  local_68 = (ulong)local_34;
  pAVar3->mArgSizesLength = local_34;
  local_78 = (undefined1  [8])&unsigned_int::typeinfo;
  _boolVal = 0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
  ;
  local_58 = 0xef2;
  pRVar5 = Memory::Recycler::TrackAllocInfo
                     (this->scriptContext->recycler,(TrackAllocData *)local_78);
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                  ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeafZero,0,(ulong)local_34);
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet(&pAStack_40->mArgSizes,ptr);
  for (uVar7 = 0; uVar7 < local_34; uVar7 = uVar7 + 1) {
    pbVar4 = ReadConstantSizedInt32(this,pbVar4,(int *)local_78);
    ptr[uVar7] = local_78._0_4_;
  }
  pAVar3 = pAStack_40;
  if ((ulong)local_32[0] != 0) {
    local_78 = (undefined1  [8])&AsmJsVarType::Which::typeinfo;
    _boolVal = 0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
    ;
    local_58 = 0xefd;
    local_68 = (ulong)local_32[0];
    pRVar5 = Memory::Recycler::TrackAllocInfo
                       (this->scriptContext->recycler,(TrackAllocData *)local_78);
    ptr_00 = Memory::AllocateArray<Memory::Recycler,Js::AsmJsVarType::Which,false>
                       ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (ulong)local_32[0]);
    pAVar3 = pAStack_40;
    Memory::WriteBarrierPtr<Js::AsmJsVarType::Which>::WriteBarrierSet(&pAStack_40->mArgType,ptr_00);
    for (uVar7 = 0; uVar7 < local_32[0]; uVar7 = uVar7 + 1) {
      pbVar4 = ReadByte(this,pbVar4,ptr_00 + uVar7);
    }
  }
  pbVar4 = ReadBool(this,pbVar4,(bool *)local_78);
  pAVar3->mUsesHeapBuffer = local_78[0];
  for (type = SIMD; -1 < (int)type; type = type - INT64) {
    pTVar6 = AsmJsFunctionInfo::GetTypedSlotInfo(pAVar3,type);
    uVar1 = *(undefined8 *)pbVar4;
    uVar2 = *(undefined8 *)(pbVar4 + 8);
    pTVar6->constCount = (int)uVar1;
    pTVar6->varCount = (int)((ulong)uVar1 >> 0x20);
    pTVar6->tmpCount = (int)uVar2;
    pTVar6->byteOffset = (int)((ulong)uVar2 >> 0x20);
    pTVar6->constSrcByteOffset = *(Type *)(pbVar4 + 0x10);
    pbVar4 = pbVar4 + 0x14;
  }
  return pbVar4;
}

Assistant:

const byte * ReadAsmJsFunctionInfo(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfAsmJsFuncInfo);
#endif

        AsmJsFunctionInfo* funcInfo = function->AllocateAsmJsFunctionInfo();

        int retVal;
        current = ReadInt32(current, &retVal);
        funcInfo->SetReturnType(AsmJsRetType((AsmJsRetType::Which)retVal));

        ArgSlot argCount;
        current = ReadUInt16(current, &argCount);
        funcInfo->SetArgCount(argCount);

        ArgSlot argByteSize;
        current = ReadUInt16(current, &argByteSize);
        funcInfo->SetArgByteSize(argByteSize);

        ArgSlot argSizeArrayLength;
        current = ReadUInt16(current, &argSizeArrayLength);
        funcInfo->SetArgSizeArrayLength(argSizeArrayLength);
        uint* argArray = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), uint, argSizeArrayLength);
        funcInfo->SetArgsSizesArray(argArray);
        for (int i = 0; i < argSizeArrayLength; i++)
        {
            int32 size;
            current = ReadConstantSizedInt32(current, &size);
            argArray[i] = (uint32)size;
        }

        if (argCount > 0)
        {
            AsmJsVarType::Which * typeArray = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), AsmJsVarType::Which, argCount);
            funcInfo->SetArgTypeArray(typeArray);
            for (uint i = 0; i < argCount; i++)
            {
                current = ReadByte(current, (byte*)&typeArray[i]);
            }
        }

        bool boolVal;
        current = ReadBool(current, &boolVal);
        funcInfo->SetUsesHeapBuffer(boolVal);

        for (int i = WAsmJs::LIMIT - 1; i >= 0; --i)
        {
            serialization_alignment WAsmJs::TypedSlotInfo* info;
            current = ReadStruct<WAsmJs::TypedSlotInfo>(current, &info);
            WAsmJs::TypedSlotInfo* typedInfo = funcInfo->GetTypedSlotInfo((WAsmJs::Types)i);
            *typedInfo = *info;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfAsmJsFuncInfo);
#endif

        return current;
    }